

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

bool __thiscall Klex::nextToken(Klex *this)

{
  int iVar1;
  CharClass CVar2;
  TokenType TVar3;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  Klex *local_18;
  Klex *this_local;
  
  local_18 = this;
  iVar1 = getChar(this);
  if (iVar1 == -1) {
    setTokenToEOF(this);
    this_local._7_1_ = false;
  }
  else {
    if (((this->isInterpolatedString & 1U) == 0) && ((this->isSimpleString & 1U) == 0)) {
      skipWhitespace(this);
    }
    iVar1 = getChar(this);
    if (iVar1 == -1) {
      setTokenToEOF(this);
      this_local._7_1_ = false;
    }
    else if (((this->shouldParseOutString & 1U) == 0) || ((this->isSimpleString & 1U) == 0)) {
      if (((this->shouldParseOutString & 1U) == 0) || ((this->isInterpolatedString & 1U) == 0)) {
        CVar2 = getCharClass(this);
        switch(CVar2) {
        case DIGIT:
          parseOutNumber_abi_cxx11_(&local_98,this);
          std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          this->tokenType = Number;
          break;
        case LETTER:
          parseOutWord_abi_cxx11_(&local_78,this);
          std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          TVar3 = getTokenTypeOfLexeme(this,&this->lexeme,true);
          this->tokenType = TVar3;
          break;
        case SINGLE_QUOTE:
          if ((this->isSimpleString & 1U) == 0) {
            this->shouldParseOutString = true;
          }
          this->isSimpleString = (bool)((this->isSimpleString ^ 0xffU) & 1);
          parseOutSymbol_abi_cxx11_(&local_b8,this);
          std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          this->tokenType = SingleQuote;
          break;
        case DOUBLE_QUOTE:
          if ((this->isInterpolatedString & 1U) == 0) {
            this->shouldParseOutString = true;
          }
          this->isInterpolatedString = (bool)((this->isInterpolatedString ^ 0xffU) & 1);
          parseOutSymbol_abi_cxx11_(&local_d8,this);
          std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          this->tokenType = DoubleQuote;
          break;
        case OTHER:
          parseOutSymbol_abi_cxx11_(&local_f8,this);
          std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          TVar3 = getTokenTypeOfLexeme(this,&this->lexeme,false);
          this->tokenType = TVar3;
        }
        this_local._7_1_ = true;
      }
      else {
        parseOutString_abi_cxx11_(&local_58,this,'\"');
        std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        this->tokenType = String;
        this->shouldParseOutString = false;
        this_local._7_1_ = true;
      }
    }
    else {
      parseOutString_abi_cxx11_(&local_38,this,'\'');
      std::__cxx11::string::operator=((string *)&this->lexeme,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      this->tokenType = String;
      this->shouldParseOutString = false;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Klex::nextToken() {
    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(!isInterpolatedString && !isSimpleString)
        skipWhitespace();

    if(getChar() == EOF) {
        setTokenToEOF();
        return false;
    }

    if(shouldParseOutString && isSimpleString) {
        lexeme = parseOutString('\'');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    if(shouldParseOutString && isInterpolatedString) {
        lexeme = parseOutString('"');
        tokenType = TokenType::String;
        shouldParseOutString = false;
        return true;
    }

    switch(getCharClass()) {
        case CharClass::LETTER:
            lexeme = parseOutWord();
            tokenType = getTokenTypeOfLexeme(lexeme, true);
            break;
        case CharClass::DIGIT:
            lexeme = parseOutNumber();
            tokenType = TokenType::Number;
            break;
        case CharClass::SINGLE_QUOTE:
            if(!isSimpleString)
                shouldParseOutString = true;
            isSimpleString = !isSimpleString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::SingleQuote;
            break;
        case CharClass::DOUBLE_QUOTE:
            if(!isInterpolatedString)
                shouldParseOutString = true;
            isInterpolatedString = !isInterpolatedString;
            lexeme = parseOutSymbol();
            tokenType = TokenType::DoubleQuote;
            break;
        case CharClass::OTHER:
            lexeme = parseOutSymbol();
            tokenType = getTokenTypeOfLexeme(lexeme);
            break;
    }

    return true;
}